

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall uttt::IBoard::GetPossibleMoves(IBoard *this)

{
  bool bVar1;
  const_reference pvVar2;
  reference pcVar3;
  vector<long,_std::allocator<long>_> *in_RSI;
  vector<long,_std::allocator<long>_> *in_RDI;
  char m_1;
  iterator __end3;
  iterator __begin3;
  vector<char,_std::allocator<char>_> *__range3;
  int i;
  char m;
  iterator __end2;
  iterator __begin2;
  vector<char,_std::allocator<char>_> *__range2;
  vector<long,_std::allocator<long>_> *moves;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  vector<long,_std::allocator<long>_> *__args;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_58;
  vector<char,_std::allocator<char>_> *local_50;
  int local_48;
  int local_38;
  char local_31;
  char *local_30;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  vector<char,_std::allocator<char>_> *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  __args = in_RDI;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x2449d5);
  if (*(char *)((long)&(in_RSI->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 6) < '\0') {
    for (local_48 = 0; local_48 < 9; local_48 = local_48 + 1) {
      pvVar2 = std::array<short,_9UL>::operator[]
                         ((array<short,_9UL> *)in_RDI,(size_type)in_stack_ffffffffffffff78);
      local_50 = g_moves + *pvVar2;
      local_58._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff78);
      std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffff78);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                 *)in_RDI,
                                (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                 *)in_stack_ffffffffffffff78), bVar1) {
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator*
                  (&local_58);
        std::vector<long,_std::allocator<long>_>::emplace_back<int>(in_RSI,(int *)__args);
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  (&local_58);
      }
    }
  }
  else {
    pvVar2 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)in_RDI,(size_type)in_stack_ffffffffffffff78);
    local_20 = g_moves + *pvVar2;
    local_28._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff78);
    local_30 = (char *)std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                               *)in_RDI,
                              (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&local_28);
      local_31 = *pcVar3;
      local_38 = *(char *)((long)&(in_RSI->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 6) * 9 + (int)local_31
      ;
      std::vector<long,_std::allocator<long>_>::emplace_back<int>(in_RSI,(int *)__args);
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&local_28);
    }
  }
  return __args;
}

Assistant:

std::vector<game::IMove>
IBoard::GetPossibleMoves() const
{
    std::vector<game::IMove> moves;
    if (next >= 0)
        for (auto m : g_moves[micro[next]])
            moves.emplace_back(next * 9 + m);
    else
        for (int i = 0; i < 9; i++)
            for (auto m : g_moves[micro[i]])
                moves.emplace_back(i * 9 + m);
    return moves;
}